

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void * arena_bin_malloc_hard(tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,uint binshard)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  long *plVar3;
  extent_t *peVar4;
  extent_t *peVar5;
  extent_t *peVar6;
  ulong size;
  arena_t *arena_00;
  int iVar7;
  szind_t sVar8;
  arena_t *arena_01;
  long lVar9;
  void *pvVar10;
  undefined4 extraout_var;
  arena_t *bin_00;
  long lVar11;
  mutex_prof_data_t *data;
  undefined4 in_register_00000084;
  bin_info_t *bin_info;
  _Bool local_64;
  _Bool zero;
  _Bool local_62;
  _Bool zero_1;
  arena_t *local_60;
  extent_hooks_t *extent_hooks;
  ulong local_50;
  pthread_mutex_t *local_48;
  extent_heap_t *local_40;
  long local_38;
  
  local_38 = CONCAT44(in_register_00000084,binshard);
  if ((manual_arena_base <= arena->base->ind) && (peVar4 = bin->slabcur, peVar4 != (extent_t *)0x0))
  {
    peVar5 = (bin->slabs_full).qlh_first;
    if (peVar5 != (extent_t *)0x0) {
      peVar6 = (peVar5->ql_link).qre_prev;
      (peVar4->ql_link).qre_prev = peVar6;
      (peVar4->ql_link).qre_next = peVar5;
      (peVar6->ql_link).qre_next = peVar4;
      (peVar5->ql_link).qre_prev = peVar4;
    }
    (bin->slabs_full).qlh_first = (peVar4->ql_link).qre_next;
    bin->slabcur = (extent_t *)0x0;
  }
  bin_info = bin_infos + binind;
  local_60 = arena;
  arena_01 = (arena_t *)extent_heap_remove_first(&bin->slabs_nonfull);
  lVar9 = -1;
  bin_00 = (arena_t *)0xd0;
  lVar11 = 0xc0;
  if (arena_01 == (arena_t *)0x0) {
    (bin->lock).field_0.field_0.locked.repr = false;
    local_48 = (pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x40);
    local_40 = &bin->slabs_nonfull;
    pthread_mutex_unlock(local_48);
    extent_hooks = (extent_hooks_t *)0x0;
    size = bin_info->reg_size;
    if (size < 0x1001) {
      local_50 = (ulong)sz_size2index_tab[size + 7 >> 3];
    }
    else {
      sVar8 = sz_size2index_compute(size);
      local_50 = CONCAT44(extraout_var,sVar8);
    }
    arena_00 = local_60;
    zero = false;
    local_64 = true;
    arena_01 = (arena_t *)
               extents_alloc(tsdn,local_60,&extent_hooks,&local_60->extents_dirty,(void *)0x0,
                             bin_infos[binind].slab_size,0,0x1000,true,binind,&zero,&local_64);
    if (arena_01 == (arena_t *)0x0) {
      if (((arena_00->decay_muzzy).time_ms.repr != 0) &&
         (arena_01 = (arena_t *)
                     extents_alloc(tsdn,arena_00,&extent_hooks,&arena_00->extents_muzzy,(void *)0x0,
                                   bin_infos[binind].slab_size,0,0x1000,true,binind,&zero,&local_64)
         , arena_01 != (arena_t *)0x0)) goto LAB_00116d06;
      zero_1 = false;
      local_62 = true;
      bin_00 = (arena_t *)0x0;
      arena_01 = (arena_t *)
                 extent_alloc_wrapper
                           (tsdn,arena_00,&extent_hooks,(void *)0x0,bin_infos[binind].slab_size,0,
                            0x1000,true,(szind_t)local_50,&zero_1,&local_62);
      if (arena_01 != (arena_t *)0x0) {
        LOCK();
        (arena_00->stats).mapped.repr = (arena_00->stats).mapped.repr + bin_infos[binind].slab_size;
        UNLOCK();
        goto LAB_00116d06;
      }
      arena_01 = (arena_t *)0x0;
    }
    else {
LAB_00116d06:
      *(ulong *)arena_01->nthreads =
           (ulong)bin_infos[binind].nregs << 0x1a | local_38 << 0x24 |
           *(ulong *)arena_01->nthreads & 0xfffffc0003ffffff;
      bitmap_init(&(arena_01->stats).decay_dirty.purged.repr,&bin_infos[binind].bitmap_info,false);
      LOCK();
      (local_60->nactive).repr =
           (local_60->nactive).repr +
           (((anon_union_8_2_694bb3b2_for_extent_s_2 *)&arena_01->last_thd)->e_size_esn >> 0xc);
      UNLOCK();
      bin_00 = local_60;
    }
    iVar7 = pthread_mutex_trylock(local_48);
    if (iVar7 != 0) {
      malloc_mutex_lock_slow(&bin->lock);
      (bin->lock).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
      (bin->lock).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    if (arena_01 == (arena_t *)0x0) {
      arena_01 = (arena_t *)extent_heap_remove_first(local_40);
      if (arena_01 == (arena_t *)0x0) {
        arena_01 = (arena_t *)0x0;
        goto LAB_00116e79;
      }
      lVar9 = -1;
      bin_00 = (arena_t *)0xd0;
      lVar11 = 0xc0;
    }
    else {
      lVar9 = 1;
      bin_00 = (arena_t *)0xc8;
      lVar11 = 0xb8;
    }
  }
  plVar3 = (long *)((long)&(bin->lock).field_0 + lVar11);
  *plVar3 = *plVar3 + 1;
  plVar3 = (long *)((long)&(bin->lock).field_0 +
                   (long)&((malloc_mutex_t *)bin_00->nthreads)->field_0);
  *plVar3 = *plVar3 + lVar9;
LAB_00116e79:
  peVar4 = bin->slabcur;
  if (peVar4 != (extent_t *)0x0) {
    if ((peVar4->e_bits & 0xffc000000) != 0) {
      pvVar10 = arena_slab_reg_alloc(peVar4,bin_info);
      if (arena_01 == (arena_t *)0x0) {
        return pvVar10;
      }
      if (((uint)(*(ulong *)arena_01->nthreads >> 0x1a) & 0x3ff) == bin_infos[binind].nregs) {
        arena_dalloc_bin_slab(tsdn,local_60,(extent_t *)arena_01,bin);
        return pvVar10;
      }
      arena_bin_lower_slab((tsdn_t *)local_60,arena_01,(extent_t *)bin,(bin_t *)bin_00);
      return pvVar10;
    }
    if (manual_arena_base <= local_60->base->ind) {
      peVar5 = (bin->slabs_full).qlh_first;
      if (peVar5 != (extent_t *)0x0) {
        peVar6 = (peVar5->ql_link).qre_prev;
        (peVar4->ql_link).qre_prev = peVar6;
        (peVar4->ql_link).qre_next = peVar5;
        (peVar6->ql_link).qre_next = peVar4;
        (peVar5->ql_link).qre_prev = peVar4;
      }
      (bin->slabs_full).qlh_first = (peVar4->ql_link).qre_next;
    }
    bin->slabcur = (extent_t *)0x0;
  }
  if (arena_01 == (arena_t *)0x0) {
    pvVar10 = (void *)0x0;
  }
  else {
    bin->slabcur = (extent_t *)arena_01;
    pvVar10 = arena_slab_reg_alloc((extent_t *)arena_01,bin_info);
  }
  return pvVar10;
}

Assistant:

static void *
arena_bin_malloc_hard(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, unsigned binshard) {
	const bin_info_t *bin_info;
	extent_t *slab;

	bin_info = &bin_infos[binind];
	if (!arena_is_auto(arena) && bin->slabcur != NULL) {
		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}
	slab = arena_bin_nonfull_slab_get(tsdn, arena, bin, binind, binshard);
	if (bin->slabcur != NULL) {
		/*
		 * Another thread updated slabcur while this one ran without the
		 * bin lock in arena_bin_nonfull_slab_get().
		 */
		if (extent_nfree_get(bin->slabcur) > 0) {
			void *ret = arena_slab_reg_alloc(bin->slabcur,
			    bin_info);
			if (slab != NULL) {
				/*
				 * arena_slab_alloc() may have allocated slab,
				 * or it may have been pulled from
				 * slabs_nonfull.  Therefore it is unsafe to
				 * make any assumptions about how slab has
				 * previously been used, and
				 * arena_bin_lower_slab() must be called, as if
				 * a region were just deallocated from the slab.
				 */
				if (extent_nfree_get(slab) == bin_info->nregs) {
					arena_dalloc_bin_slab(tsdn, arena, slab,
					    bin);
				} else {
					arena_bin_lower_slab(tsdn, arena, slab,
					    bin);
				}
			}
			return ret;
		}

		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}

	if (slab == NULL) {
		return NULL;
	}
	bin->slabcur = slab;

	assert(extent_nfree_get(bin->slabcur) > 0);

	return arena_slab_reg_alloc(slab, bin_info);
}